

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_sse_single(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  
  if (len < 0x8000) {
    iVar4 = 0;
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = 0;
  }
  else {
    auVar2 = vpmovzxbw_avx(ZEXT816(0x8040201008040201));
    auVar8 = vmovdqa64_avx512vl(_DAT_001150b0);
    auVar27._8_8_ = 0x80800d0c80800b0a;
    auVar27._0_8_ = 0x80800d0c80800b0a;
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = 0;
    iVar4 = 0;
    do {
      auVar25 = ZEXT1664((undefined1  [16])0x0);
      auVar28 = ZEXT1664((undefined1  [16])0x0);
      lVar7 = 0;
      do {
        uVar1 = *(undefined2 *)((long)data + lVar7);
        auVar29._2_2_ = uVar1;
        auVar29._0_2_ = uVar1;
        auVar29._4_2_ = uVar1;
        auVar29._6_2_ = uVar1;
        auVar29._8_2_ = uVar1;
        auVar29._10_2_ = uVar1;
        auVar29._12_2_ = uVar1;
        auVar29._14_2_ = uVar1;
        auVar9 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)data + lVar7 + 4)));
        auVar10 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)data + lVar7 + 8)));
        auVar11 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)data + lVar7 + 0xc)));
        auVar12 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)data + lVar7 + 0x10)));
        auVar13 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)data + lVar7 + 0x14)));
        auVar14 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)data + lVar7 + 0x18)));
        auVar15 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)data + lVar7 + 0x1c)));
        lVar7 = lVar7 + 0x10;
        auVar22 = vpand_avx(auVar29,_DAT_00115090);
        auVar16 = vpandq_avx512vl(auVar9,_DAT_00115090);
        auVar17 = vpandq_avx512vl(auVar10,_DAT_00115090);
        auVar18 = vpandq_avx512vl(auVar11,_DAT_00115090);
        auVar19 = vpandq_avx512vl(auVar12,_DAT_00115090);
        auVar20 = vpandq_avx512vl(auVar13,_DAT_00115090);
        auVar21 = vpandq_avx512vl(auVar14,_DAT_00115090);
        auVar22 = vpcmpeqw_avx(auVar22,_DAT_00115090);
        auVar16 = vpcmpeqw_avx(auVar16,_DAT_00115090);
        auVar17 = vpcmpeqw_avx(auVar17,_DAT_00115090);
        auVar18 = vpcmpeqw_avx(auVar18,_DAT_00115090);
        auVar19 = vpcmpeqw_avx(auVar19,_DAT_00115090);
        auVar20 = vpcmpeqw_avx(auVar20,_DAT_00115090);
        auVar21 = vpcmpeqw_avx(auVar21,_DAT_00115090);
        auVar22 = vpsubw_avx(auVar25._0_16_,auVar22);
        auVar22 = vpsubw_avx(auVar22,auVar16);
        auVar22 = vpsubw_avx(auVar22,auVar17);
        auVar22 = vpsubw_avx(auVar22,auVar18);
        auVar22 = vpsubw_avx(auVar22,auVar19);
        auVar22 = vpsubw_avx(auVar22,auVar20);
        auVar16 = vpsubw_avx(auVar22,auVar21);
        auVar22 = vpandq_avx512vl(auVar15,_DAT_00115090);
        auVar22 = vpcmpeqw_avx(auVar22,_DAT_00115090);
        auVar16 = vpsubw_avx(auVar16,auVar22);
        auVar25 = ZEXT1664(auVar16);
        auVar22 = vpand_avx(auVar29,auVar2);
        auVar22 = vpcmpeqw_avx(auVar22,auVar2);
        auVar17 = vpsubw_avx(auVar28._0_16_,auVar22);
        auVar22 = vpandq_avx512vl(auVar9,auVar2);
        auVar22 = vpcmpeqw_avx(auVar22,auVar2);
        auVar17 = vpsubw_avx(auVar17,auVar22);
        auVar22 = vpandq_avx512vl(auVar10,auVar2);
        auVar22 = vpcmpeqw_avx(auVar22,auVar2);
        auVar17 = vpsubw_avx(auVar17,auVar22);
        auVar22 = vpandq_avx512vl(auVar11,auVar2);
        auVar22 = vpcmpeqw_avx(auVar22,auVar2);
        auVar17 = vpsubw_avx(auVar17,auVar22);
        auVar22 = vpandq_avx512vl(auVar12,auVar2);
        auVar22 = vpcmpeqw_avx(auVar22,auVar2);
        auVar17 = vpsubw_avx(auVar17,auVar22);
        auVar22 = vpandq_avx512vl(auVar13,auVar2);
        auVar22 = vpcmpeqw_avx(auVar22,auVar2);
        auVar17 = vpsubw_avx(auVar17,auVar22);
        auVar22 = vpandq_avx512vl(auVar14,auVar2);
        auVar22 = vpcmpeqw_avx(auVar22,auVar2);
        auVar17 = vpsubw_avx(auVar17,auVar22);
        auVar22 = vpandq_avx512vl(auVar15,auVar2);
        auVar22 = vpcmpeqw_avx(auVar22,auVar2);
        auVar22 = vpsubw_avx(auVar17,auVar22);
        auVar28 = ZEXT1664(auVar22);
      } while ((int)lVar7 != 0x10000);
      iVar6 = vpextrw_avx(auVar22,0);
      auVar22 = vpalignr_avx(auVar16,auVar22,2);
      auVar18 = vpshufb_avx512vl(auVar16,auVar8);
      auVar17 = vpshufb_avx(auVar16,auVar27);
      uVar5 = uVar5 + 1;
      data = data + 0x8000;
      iVar4 = iVar4 + iVar6;
      vpextrw_avx(auVar16,7);
      auVar3 = vpmovzxwd_avx2(auVar22);
      auVar22 = vpaddd_avx(auVar18,auVar23._0_16_);
      auVar23 = ZEXT1664(auVar22);
      auVar22 = vpaddd_avx(auVar26._0_16_,auVar17);
      auVar26 = ZEXT1664(auVar22);
      auVar3 = vpaddd_avx2(auVar3,auVar24._0_32_);
      auVar24 = ZEXT3264(auVar3);
    } while (uVar5 != len >> 0xf);
    auVar25 = vpmovsxbd_avx512f(_DAT_001150d0);
    uVar5 = len & 0xffff8000;
    auVar28 = valignd_avx512f(auVar24,auVar24,0xf);
    auVar24._60_4_ = 0;
    auVar24._0_60_ = auVar28._4_60_;
    auVar23 = vpermi2d_avx512f(auVar25,auVar24 << 0x20,auVar23);
    auVar24 = vpmovsxbd_avx512f(_DAT_001150e0);
    auVar23 = vpermi2d_avx512f(auVar24,auVar23,auVar26);
    auVar24 = vpbroadcastd_avx512f();
    auVar26._60_4_ = auVar24._60_4_;
    auVar26._0_60_ = auVar23._0_60_;
  }
  auVar2 = vpinsrd_avx(auVar26._0_16_,iVar4,0);
  auVar23 = vinserti32x4_avx512f(auVar26,auVar2,0);
  if (uVar5 < len) {
    auVar24 = vpmovsxbd_avx512f(_DAT_00115080);
    auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar5 = uVar5 + 1;
      auVar25 = vpbroadcastd_avx512f();
      auVar25 = vpsrlvd_avx512f(auVar25,auVar24);
      auVar25 = vpandd_avx512f(auVar25,auVar26);
      auVar23 = vpaddd_avx512f(auVar25,auVar23);
    } while (uVar5 < len);
  }
  auVar23 = vmovdqu64_avx512f(auVar23);
  *(undefined1 (*) [64])flags = auVar23;
  return 0;
}

Assistant:

int pospopcnt_u16_sse_single(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m128i counterLo = _mm_set1_epi16(0);
    __m128i counterHi = _mm_set1_epi16(0);
    const __m128i one_mask =  _mm_set1_epi16(1);
    // set_epi is parameterized backwards (15->0)
    const __m128i masksLo = _mm_set_epi16(-32768, 1 << 14, 1 << 13, 1 << 12,
                                          1 << 11, 1 << 10, 1 << 9,  1 << 8);
    const __m128i masksHi = _mm_set_epi16(1 << 7,  1 << 6,  1 << 5,  1 << 4,
                                          1 << 3,  1 << 2,  1 << 1,  1 << 0);

    uint32_t out_counters[16] = {0};
    const __m128i* data_vectors = (const __m128i*)(data);
    const uint32_t n_cycles = len / 8;
    const uint32_t n_update_cycles = n_cycles / 4096;

#define UPDATE_LO(idx) counterLo = _mm_add_epi16(counterLo, _mm_and_si128(_mm_cmpeq_epi16(_mm_and_si128(_mm_set1_epi16(_mm_extract_epi16(_mm_loadu_si128(data_vectors+pos), idx)), masksLo), masksLo), one_mask));
#define UPDATE_HI(idx) counterHi = _mm_add_epi16(counterHi, _mm_and_si128(_mm_cmpeq_epi16(_mm_and_si128(_mm_set1_epi16(_mm_extract_epi16(_mm_loadu_si128(data_vectors+pos), idx)), masksHi), masksHi), one_mask));
#define BLOCK {                                         \
    UPDATE_LO(0) UPDATE_LO(1) UPDATE_LO(2) UPDATE_LO(3) \
    UPDATE_LO(4) UPDATE_LO(5) UPDATE_LO(6) UPDATE_LO(7) \
    UPDATE_HI(0) UPDATE_HI(1) UPDATE_HI(2) UPDATE_HI(3) \
    UPDATE_HI(4) UPDATE_HI(5) UPDATE_HI(6) UPDATE_HI(7) \
}
#define UH(idx) out_counters[idx] += _mm_extract_epi16(counterLo, idx - 8);
#define UL(idx) out_counters[idx] += _mm_extract_epi16(counterHi, idx);

    uint32_t pos = 0;
    for (int i = 0; i < n_update_cycles; ++i) { // each block of 65536 values
        for (int k = 0; k < 4096; ++k, ++pos) { // max sum of each 16-bit value in a register (65536/16)
            BLOCK
        }

        // Compute vector sum (unroll to prevent possible compiler errors
        // regarding constness of parameter N in _mm_extract_epi16).
        UL(0)  UL(1)  UL(2)  UL(3)
        UL(4)  UL(5)  UL(6)  UL(7)
        UH(8)  UH(9)  UH(10) UH(11)
        UH(12) UH(13) UH(14) UH(15)
        counterLo = _mm_set1_epi16(0);
        counterHi = _mm_set1_epi16(0);
    }

#undef UL
#undef UH
#undef BLOCK
#undef UPDATE_HI
#undef UPDATE_LO

    // residual
    for (int i = pos*8; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

    return 0;
}